

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O0

void __thiscall
glcts::TestConfiguration<unsigned_short,_unsigned_char>::TestConfiguration
          (TestConfiguration<unsigned_short,_unsigned_char> *this,
          TestConfiguration<unsigned_short,_unsigned_char> *configuration)

{
  uchar uVar1;
  unsigned_short uVar2;
  GLsizei GVar3;
  GLenum GVar4;
  GLuint GVar5;
  TestConfiguration<unsigned_short,_unsigned_char> *configuration_local;
  TestConfiguration<unsigned_short,_unsigned_char> *this_local;
  
  this->_vptr_TestConfiguration = (_func_int **)&PTR__TestConfiguration_0326e198;
  GVar3 = get_n_in_components(configuration);
  this->m_n_in_components = GVar3;
  GVar3 = get_n_out_components(configuration);
  this->m_n_out_components = GVar3;
  GVar4 = get_target(configuration);
  this->m_target = GVar4;
  GVar4 = get_input_internal_format(configuration);
  this->m_input_internal_format = GVar4;
  GVar4 = get_output_internal_format(configuration);
  this->m_output_internal_format = GVar4;
  GVar4 = get_filtering(configuration);
  this->m_filtering = GVar4;
  GVar4 = get_input_format(configuration);
  this->m_input_format = GVar4;
  GVar4 = get_output_format(configuration);
  this->m_output_format = GVar4;
  GVar5 = get_width(configuration);
  this->m_width = GVar5;
  GVar5 = get_height(configuration);
  this->m_height = GVar5;
  GVar5 = get_depth(configuration);
  this->m_depth = GVar5;
  uVar2 = get_init_value(configuration);
  this->m_init_value = uVar2;
  uVar2 = get_init_border_color(configuration);
  this->m_init_border_color = uVar2;
  uVar1 = get_expected_value(configuration);
  this->m_expected_value = uVar1;
  uVar1 = get_expected_border_color(configuration);
  this->m_expected_border_color = uVar1;
  GVar4 = get_input_type(configuration);
  this->m_input_type = GVar4;
  GVar4 = get_output_type(configuration);
  this->m_output_type = GVar4;
  return;
}

Assistant:

TestConfiguration<InputType, OutputType>::TestConfiguration(const TestConfiguration& configuration)
{
	m_n_in_components		 = configuration.get_n_in_components();
	m_n_out_components		 = configuration.get_n_out_components();
	m_target				 = configuration.get_target();
	m_input_internal_format  = configuration.get_input_internal_format();
	m_output_internal_format = configuration.get_output_internal_format();
	m_filtering				 = configuration.get_filtering();
	m_input_format			 = configuration.get_input_format();
	m_output_format			 = configuration.get_output_format();
	m_width					 = configuration.get_width();
	m_height				 = configuration.get_height();
	m_depth					 = configuration.get_depth();
	m_init_value			 = configuration.get_init_value();
	m_init_border_color		 = configuration.get_init_border_color();
	m_expected_value		 = configuration.get_expected_value();
	m_expected_border_color  = configuration.get_expected_border_color();
	m_input_type			 = configuration.get_input_type();
	m_output_type			 = configuration.get_output_type();
}